

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::Simulator::set_value_(Simulator *this,Var *var,optional<unsigned_long> op_value)

{
  VarType VVar1;
  pointer puVar2;
  ulong *puVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  undefined4 extraout_var;
  pair<unsigned_int,_unsigned_int> pVar9;
  iterator iVar10;
  _Storage<unsigned_long,_true> *p_Var11;
  mapped_type *pmVar12;
  UserException *pUVar13;
  InternalException *pIVar14;
  byte bVar15;
  pointer puVar16;
  _Storage<unsigned_long,_true> _Var17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  byte bVar21;
  long lVar22;
  basic_string_view<char> bVar23;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<unsigned_long> __l;
  _Storage<unsigned_long,_true> _Stack_d8;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  __node_base_ptr local_b8 [3];
  undefined1 local_a0 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  Var *local_40;
  Var *var_local;
  Var *root;
  
  _Var17._M_value =
       op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       op_value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    puVar16 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_40 = var;
    if (((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar16 == 4) && (*puVar16 == 1)) {
      VVar1 = var->type_;
      if (VVar1 == Slice) {
        iVar5 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
        var_local = (Var *)CONCAT44(extraout_var,iVar5);
        values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_d8._M_value = 0;
        values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if ((var_local->type_ == Parameter) || (var_local->type_ == ConstValue)) {
          pUVar13 = (UserException *)__cxa_allocate_exception(0x10);
          (*(var->super_IRNode)._vptr_IRNode[0x20])(&changed_bits._M_h._M_single_bucket,var);
          local_b8[0] = changed_bits._M_h._M_single_bucket;
          bVar23 = fmt::v7::to_string_view<char,_0>("Cannot set value for constant {0}");
          format_str_00.data_ = (char *)bVar23.size_;
          format_str_00.size_ = 0xd;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_b8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_a0,(detail *)bVar23.data_,format_str_00,args_00);
          UserException::UserException(pUVar13,(string *)local_a0);
          __cxa_throw(pUVar13,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar16 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (var_local->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((long)puVar2 - (long)puVar16 == 4) && (*puVar16 == 1)) {
          iVar7 = std::
                  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)this,&var_local);
          if (iVar7.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
              _M_cur == (__node_type *)0x0) {
            pmVar8 = std::__detail::
                     _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this,&var_local);
            *pmVar8 = 0;
          }
          local_a0 = (undefined1  [8])
                     std::__detail::
                     _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&var_local);
          std::vector<unsigned_long*,std::allocator<unsigned_long*>>::
          _M_assign_aux<unsigned_long*const*>
                    ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&_Stack_d8,local_a0);
        }
        else {
          uVar18 = 1;
          for (; puVar16 != puVar2; puVar16 = puVar16 + 1) {
            uVar18 = uVar18 * *puVar16;
          }
          this_00 = &this->complex_values_;
          iVar10 = std::
                   _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&this_00->_M_h,&var_local);
          uVar20 = (ulong)uVar18;
          if (iVar10.
              super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,uVar20,
                       (allocator_type *)&changed_bits._M_h._M_single_bucket);
            for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
              *(mapped_type *)((long)local_a0 + uVar19 * 8) = 0;
            }
            std::
            _Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                      ((_Hashtable<kratos::Var_const*,std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this_00,&var_local,local_a0);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
          }
          pmVar12 = std::__detail::
                    _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&var_local);
          std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                    ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&_Stack_d8,uVar20)
          ;
          for (lVar22 = 0; uVar20 << 3 != lVar22; lVar22 = lVar22 + 8) {
            local_a0 = (undefined1  [8])
                       ((long)(pmVar12->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar22);
            std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                      ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&_Stack_d8,
                       (unsigned_long **)local_a0);
          }
        }
        get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&changed_bits._M_h._M_single_bucket,this,var);
        if ((pointer)changed_bits._M_h._M_single_bucket ==
            index.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"Empty slice",(allocator<char> *)local_b8);
          InternalException::InternalException(pIVar14,(string *)local_a0);
          __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        pVar9 = compute_var_high_low
                          (var_local,
                           (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            *)&changed_bits._M_h._M_single_bucket);
        uVar18 = (*(var_local->super_IRNode)._vptr_IRNode[7])();
        if (uVar18 < (pVar9.first - pVar9.second) + 1) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"Unable to resolve variable slicing",
                     (allocator<char> *)local_b8);
          InternalException::InternalException(pIVar14,(string *)local_a0);
          __cxa_throw(pIVar14,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar18 = var_local->var_width_;
        uVar20 = ((ulong)pVar9 >> 0x20) / (ulong)uVar18;
        uVar6 = 0;
        cVar4 = (char)pVar9.first - (char)uVar18 * (char)uVar20;
        puVar3 = *(ulong **)(_Stack_d8._M_value + uVar20 * 8);
        bVar15 = (byte)(((ulong)pVar9 >> 0x20) % (ulong)uVar18);
        uVar20 = *puVar3;
        bVar21 = (cVar4 - bVar15) + 1;
        uVar19 = ((_Var17._M_value << (bVar21 & 0x3f)) >> (bVar21 & 0x3f)) << (bVar15 & 0x3f) |
                 ~((0xffffffffffffffffU >> (cVar4 + 1U & 0x3f)) >> (bVar15 & 0x3f)) & uVar20;
        *puVar3 = uVar19;
        if (uVar19 != uVar20) {
          local_a0 = (undefined1  [8])&changed_bits._M_h._M_rehash_policy._M_next_resize;
          changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
          changed_bits._M_h._M_bucket_count = 0;
          changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
          changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          changed_bits._M_h._M_rehash_policy._4_4_ = 0;
          changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
          while( true ) {
            local_b8[0] = (__node_base_ptr)CONCAT44(local_b8[0]._4_4_,uVar6);
            uVar18 = (*(var_local->super_IRNode)._vptr_IRNode[7])();
            if (uVar18 <= uVar6) break;
            if (((uVar19 ^ uVar20) >> ((ulong)local_b8[0] & 0x3f) & 1) != 0) {
              std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<unsigned_int&>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_a0,local_b8);
            }
            uVar6 = (int)local_b8[0] + 1;
          }
          trigger_event(this,var_local,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_a0);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_a0);
        }
        std::
        _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&changed_bits._M_h._M_single_bucket);
        std::_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~_Vector_base
                  ((_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&_Stack_d8);
      }
      else {
        if ((VVar1 == Parameter) || (VVar1 == ConstValue)) {
          pUVar13 = (UserException *)__cxa_allocate_exception(0x10);
          (*(var->super_IRNode)._vptr_IRNode[0x20])(&changed_bits._M_h._M_single_bucket,var);
          _Stack_d8 = (_Storage<unsigned_long,_true>)changed_bits._M_h._M_single_bucket;
          bVar23 = fmt::v7::to_string_view<char,_0>("Cannot set value for constant {0}");
          format_str.data_ = (char *)bVar23.size_;
          format_str.size_ = 0xd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&_Stack_d8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_a0,(detail *)bVar23.data_,format_str,args);
          UserException::UserException(pUVar13,(string *)local_a0);
          __cxa_throw(pUVar13,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        local_a0 = (undefined1  [8])&changed_bits._M_h._M_rehash_policy._M_next_resize;
        changed_bits._M_h._M_buckets = (__buckets_ptr)0x1;
        changed_bits._M_h._M_bucket_count = 0;
        changed_bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        changed_bits._M_h._M_element_count._0_4_ = 0x3f800000;
        changed_bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        changed_bits._M_h._M_rehash_policy._4_4_ = 0;
        changed_bits._M_h._M_rehash_policy._M_next_resize = 0;
        iVar7 = std::
                _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,&local_40);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false>.
            _M_cur == (__node_type *)0x0) {
          p_Var11 = (_Storage<unsigned_long,_true> *)
                    std::__detail::
                    _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this,&local_40);
          p_Var11->_M_value = (unsigned_long)_Var17;
          uVar18 = 0;
          while( true ) {
            changed_bits._M_h._M_single_bucket =
                 (__node_base_ptr)CONCAT44(changed_bits._M_h._M_single_bucket._4_4_,uVar18);
            uVar6 = (*(local_40->super_IRNode)._vptr_IRNode[7])();
            if (uVar6 <= uVar18) break;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_int&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_a0,&changed_bits._M_h._M_single_bucket);
            uVar18 = (int)changed_bits._M_h._M_single_bucket + 1;
          }
        }
        else {
          pmVar8 = std::__detail::
                   _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_40);
          uVar20 = *pmVar8;
          if (uVar20 != _Var17._M_value) {
            p_Var11 = (_Storage<unsigned_long,_true> *)
                      std::__detail::
                      _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,&local_40);
            p_Var11->_M_value = (unsigned_long)_Var17;
            uVar18 = 0;
            while( true ) {
              changed_bits._M_h._M_single_bucket =
                   (__node_base_ptr)CONCAT44(changed_bits._M_h._M_single_bucket._4_4_,uVar18);
              uVar6 = (*(local_40->super_IRNode)._vptr_IRNode[7])();
              if (uVar6 <= uVar18) break;
              if (((uVar20 ^ _Var17._M_value) >> ((ulong)changed_bits._M_h._M_single_bucket & 0x3f)
                  & 1) != 0) {
                std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::_M_emplace<unsigned_int&>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_a0,&changed_bits._M_h._M_single_bucket);
              }
              uVar18 = (int)changed_bits._M_h._M_single_bucket + 1;
            }
          }
        }
        trigger_event(this,local_40,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)local_a0);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_a0);
      }
    }
    else {
      __l._M_len = 1;
      __l._M_array = (iterator)&_Stack_d8;
      _Stack_d8._M_value = _Var17._M_value;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &changed_bits._M_h._M_single_bucket,__l,(allocator_type *)local_b8);
      local_a0 = (undefined1  [8])changed_bits._M_h._M_single_bucket;
      changed_bits._M_h._M_single_bucket = (__node_base_ptr)0x0;
      changed_bits._M_h._M_before_begin._M_nxt._0_1_ = 1;
      set_complex_value_(this,var,(optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)local_a0);
      std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)local_a0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &changed_bits._M_h._M_single_bucket);
    }
  }
  return;
}

Assistant:

void Simulator::set_value_(const kratos::Var *var, std::optional<uint64_t> op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() != 1 || var->size().front() != 1) {
        set_complex_value_(var, std::vector<uint64_t>{value});
        return;
    }
    if (var->type() == VarType::Parameter || var->type() == VarType::ConstValue) {
        throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
    } else if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        std::vector<uint64_t *> values;
        if (root->type() == VarType::ConstValue || root->type() == VarType::Parameter) {
            throw UserException(::format("Cannot set value for constant {0}", var->handle_name()));
        } else if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            uint32_t base = 1;
            for (uint32_t s : root->size()) {
                base *= s;
            }
            if (complex_values_.find(root) == complex_values_.end()) {
                // fill in values
                std::vector<uint64_t> v(base);
                for (uint64_t i = 0; i < base; i++) v[i] = 0;
                complex_values_.emplace(root, v);
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
        // obtain the index
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto [var_high, var_low] = compute_var_high_low(root, index);
        if (var_high + 1 - var_low > root->width())
            throw InternalException("Unable to resolve variable slicing");
        auto base = var_low / root->var_width();
        var_high = var_high - base * root->var_width();
        var_low = var_low - base * root->var_width();
        auto *v = values[base];
        auto temp = *v;
        // compute the mask
        uint64_t mask = (0xFFFFFFFFFFFFFFFF >> (var_high + 1)) >> var_low;
        *v = *v & (~mask);
        value = value & (0xFFFFFFFFFFFFFFFF >> (var_high - var_low + 1));
        *v = *v | (value << var_low);
        if (*v != temp) {
            std::unordered_set<uint32_t> changed_bits;
            uint64_t m = (*v) ^ temp;
            for (uint32_t bit = 0; bit < root->width(); bit++) {
                if ((m >> bit) & 1u) {
                    changed_bits.emplace(bit);
                }
            }
            trigger_event(root, changed_bits);
        }
    } else {
        std::unordered_set<uint32_t> changed_bits;
        if (values_.find(var) != values_.end()) {
            auto temp = values_.at(var);
            if (temp != value) {
                values_[var] = value;
                uint64_t m = value ^ temp;
                for (uint32_t bit = 0; bit < var->width(); bit++) {
                    if ((m >> bit) & 1u) {
                        changed_bits.emplace(bit);
                    }
                }
            }
        } else {
            values_[var] = value;
            for (uint32_t i = 0; i < var->width(); i++) changed_bits.emplace(i);
        }
        trigger_event(var, changed_bits);
    }
}